

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIFont::draw
          (CGUIFont *this,stringw *text,rect<int> *position,SColor color,bool hcenter,bool vcenter,
          rect<int> *clip)

{
  _Rb_tree_header *p_Var1;
  u32 *puVar2;
  wchar_t wVar3;
  uint uVar4;
  vector2d<int> vVar5;
  pointer pwVar6;
  pointer pSVar7;
  int iVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  u32 *puVar12;
  int iVar13;
  ulong uVar14;
  vector2d<int> offset;
  undefined8 local_98;
  SColor color_local;
  array<unsigned_int> indices;
  array<irr::core::vector2d<int>_> offsets;
  
  if (this->Driver == (IVideoDriver *)0x0) {
    return;
  }
  if (this->SpriteBank == (IGUISpriteBank *)0x0) {
    return;
  }
  vVar5 = position->UpperLeftCorner;
  local_98 = 0;
  iVar8 = 0;
  offset = vVar5;
  color_local.color = color.color;
  if ((vcenter || hcenter) || clip != (rect<int> *)0x0) {
    local_98 = (**(code **)(*(long *)this + 8))(this,(text->str)._M_dataplus._M_p);
    iVar8 = (int)((ulong)local_98 >> 0x20);
  }
  if (hcenter) {
    offset.X = ((position->LowerRightCorner).X - ((position->UpperLeftCorner).X + (int)local_98) >>
               1) + vVar5.X;
  }
  if (vcenter) {
    offset.Y = ((position->LowerRightCorner).Y - ((position->UpperLeftCorner).Y + iVar8) >> 1) +
               vVar5.Y;
  }
  if (clip != (rect<int> *)0x0) {
    indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)offset;
    indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)CONCAT44(iVar8 + offset.Y,(int)local_98 + offset.X)
    ;
    core::rect<int>::clipAgainst((rect<int> *)&indices,clip);
    if ((int)indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish <
        (int)indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start) {
      return;
    }
    if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ <
        indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_) {
      return;
    }
  }
  uVar14 = 0;
  indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.is_sorted = true;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&indices.m_data,(ulong)(uint)(text->str)._M_string_length);
  offsets.m_data.
  super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsets.m_data.
  super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.m_data.
  super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsets.is_sorted = true;
  ::std::vector<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>::reserve
            (&offsets.m_data,(ulong)(uint)(text->str)._M_string_length);
  uVar9 = (ulong)(uint)(text->str)._M_string_length;
  if (uVar9 != 0) {
    p_Var1 = &(this->CharacterMap)._M_t._M_impl.super__Rb_tree_header;
    puVar2 = &this->WrongCharacter;
    do {
      iVar13 = (int)uVar14;
      pwVar6 = (text->str)._M_dataplus._M_p;
      wVar3 = pwVar6[uVar14];
      iVar8 = iVar13;
      if (wVar3 == L'\n') {
LAB_0021da4f:
        iVar13 = iVar8;
        offset.Y = offset.Y + this->MaxHeight;
        offset.X = (position->UpperLeftCorner).X;
        if (hcenter) {
          offset.X = ((position->LowerRightCorner).X - ((int)local_98 + offset.X) >> 1) + offset.X;
        }
      }
      else {
        if (wVar3 == L'\r') {
          iVar8 = iVar13 + 1;
          if (pwVar6[uVar14 + 1] != L'\n') {
            iVar8 = iVar13;
          }
          goto LAB_0021da4f;
        }
        p_Var11 = (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var1->_M_header;
        puVar12 = puVar2;
        if (p_Var11 != (_Base_ptr)0x0) {
          do {
            if (wVar3 <= (wchar_t)*(size_t *)(p_Var11 + 1)) {
              p_Var10 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(wchar_t)*(size_t *)(p_Var11 + 1) < wVar3];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
             (puVar12 = (u32 *)((long)&((_Rb_tree_header *)p_Var10)->_M_node_count + 4),
             wVar3 < (wchar_t)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
            puVar12 = puVar2;
          }
        }
        uVar4 = *puVar12;
        pSVar7 = (this->Areas).m_data.
                 super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        offset.X = offset.X + pSVar7[uVar4].underhang;
        iVar8 = ::std::__cxx11::wstring::find((int)this + L'\x80',(ulong)(uint)wVar3);
        if (iVar8 < 0) {
          if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&indices,
                       (iterator)
                       indices.m_data.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&pSVar7[uVar4].spriteno);
          }
          else {
            *indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = pSVar7[uVar4].spriteno;
            indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          indices.is_sorted = false;
          core::array<irr::core::vector2d<int>_>::push_back(&offsets,&offset);
        }
        offset.X = offset.X +
                   pSVar7[uVar4].overhang + pSVar7[uVar4].width + this->GlobalKerningWidth;
        uVar9 = (text->str)._M_string_length;
      }
      uVar14 = (ulong)(iVar13 + 1U);
    } while (iVar13 + 1U < (uint)uVar9);
  }
  (*this->SpriteBank->_vptr_IGUISpriteBank[10])
            (this->SpriteBank,&indices,&offsets,clip,&color_local,0,0,1,0);
  if (offsets.m_data.
      super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(offsets.m_data.
                    super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)offsets.m_data.
                          super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)offsets.m_data.
                          super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.m_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)indices.m_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CGUIFont::draw(const core::stringw &text, const core::rect<s32> &position,
		video::SColor color,
		bool hcenter, bool vcenter, const core::rect<s32> *clip)
{
	if (!Driver || !SpriteBank)
		return;

	core::dimension2d<s32> textDimension; // NOTE: don't make this u32 or the >> later on can fail when the dimension width is < position width
	core::position2d<s32> offset = position.UpperLeftCorner;

	if (hcenter || vcenter || clip)
		textDimension = getDimension(text.c_str());

	if (hcenter)
		offset.X += (position.getWidth() - textDimension.Width) >> 1;

	if (vcenter)
		offset.Y += (position.getHeight() - textDimension.Height) >> 1;

	if (clip) {
		core::rect<s32> clippedRect(offset, textDimension);
		clippedRect.clipAgainst(*clip);
		if (!clippedRect.isValid())
			return;
	}

	core::array<u32> indices(text.size());
	core::array<core::position2di> offsets(text.size());

	for (u32 i = 0; i < text.size(); i++) {
		wchar_t c = text[i];

		bool lineBreak = false;
		if (c == L'\r') { // Mac or Windows breaks
			lineBreak = true;
			if (text[i + 1] == L'\n') // Windows breaks
				c = text[++i];
		} else if (c == L'\n') { // Unix breaks
			lineBreak = true;
		}

		if (lineBreak) {
			offset.Y += MaxHeight;
			offset.X = position.UpperLeftCorner.X;

			if (hcenter) {
				offset.X += (position.getWidth() - textDimension.Width) >> 1;
			}
			continue;
		}

		SFontArea &area = Areas[getAreaFromCharacter(c)];

		offset.X += area.underhang;
		if (Invisible.findFirst(c) < 0) {
			indices.push_back(area.spriteno);
			offsets.push_back(offset);
		}

		offset.X += area.width + area.overhang + GlobalKerningWidth;
	}

	SpriteBank->draw2DSpriteBatch(indices, offsets, clip, color);
}